

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

google_protobuf_FieldDescriptorProto **
google_protobuf_DescriptorProto_field(google_protobuf_DescriptorProto *msg,size_t *size)

{
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  size_t *size_local;
  google_protobuf_DescriptorProto *msg_local;
  
  stack0xffffffffffffffd4 = 0x2000000002;
  field.number_dont_copy_me__upb_internal_use_only = 0xc10b0000;
  field._4_8_ = size;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&google__protobuf__FieldDescriptorProto_msg_init);
  array = upb_Message_GetArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4));
  if (array == (upb_Array *)0x0) {
    if (field._4_8_ != 0) {
      *(undefined8 *)field._4_8_ = 0;
    }
    msg_local = (google_protobuf_DescriptorProto *)0x0;
  }
  else {
    if (field._4_8_ != 0) {
      *(size_t *)field._4_8_ = array->size_dont_copy_me__upb_internal_use_only;
    }
    msg_local = (google_protobuf_DescriptorProto *)upb_Array_DataPtr(array);
  }
  return (google_protobuf_FieldDescriptorProto **)msg_local;
}

Assistant:

UPB_INLINE const google_protobuf_FieldDescriptorProto* const* google_protobuf_DescriptorProto_field(const google_protobuf_DescriptorProto* msg, size_t* size) {
  const upb_MiniTableField field = {2, UPB_SIZE(12, 32), 0, 0, 11, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__FieldDescriptorProto_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const google_protobuf_FieldDescriptorProto* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}